

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  int in_ESI;
  ExtensionSet *in_RDI;
  KeyValue *it;
  KeyValue *end;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  Extension *local_8;
  
  bVar1 = is_large(in_RDI);
  if (bVar1) {
    local_8 = FindOrNullInLargeMap
                        ((ExtensionSet *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  else {
    pKVar2 = flat_end(in_RDI);
    pKVar3 = flat_begin(in_RDI);
    pKVar3 = std::
             lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                       (pKVar3,pKVar2,&stack0xffffffffffffffec);
    if ((pKVar3 == pKVar2) || (pKVar3->first != in_ESI)) {
      local_8 = (Extension *)0x0;
    }
    else {
      local_8 = &pKVar3->second;
    }
  }
  return local_8;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    return FindOrNullInLargeMap(key);
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return &it->second;
  }
  return NULL;
}